

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O3

void __thiscall
slang::syntax::StandardPropertyCaseItemSyntax::setChild
          (StandardPropertyCaseItemSyntax *this,size_t index,TokenOrSyntax child)

{
  (*(code *)(&DAT_00259860 + *(int *)(&DAT_00259860 + index * 4)))();
  return;
}

Assistant:

void StandardPropertyCaseItemSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: expressions = child.node()->as<SeparatedSyntaxList<ExpressionSyntax>>(); return;
        case 1: colon = child.token(); return;
        case 2: expr = child.node() ? &child.node()->as<PropertyExprSyntax>() : nullptr; return;
        case 3: semi = child.token(); return;
        default: SLANG_UNREACHABLE;
    }
}